

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O3

void __thiscall
pbrt::FilterSampler::FilterSampler(FilterSampler *this,FilterHandle *filter,Allocator alloc)

{
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *other;
  Tuple2<pbrt::Point2,_float> TVar1;
  Bounds2f BVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  GaussianFilter *this_00;
  MitchellFilter *this_01;
  int iVar16;
  int iVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  span<const_float> func;
  Point2f p;
  PiecewiseConstant2D local_b0;
  
  uVar15 = 0;
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       *(ulong *)((filter->
                  super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
                  ).bits & 0xffffffffffff);
  auVar18._8_4_ = 0x80000000;
  auVar18._0_8_ = 0x8000000080000000;
  auVar18._12_4_ = 0x80000000;
  auVar18 = vxorps_avx512vl(auVar21,auVar18);
  auVar19 = vminps_avx(auVar21,auVar18);
  auVar18 = vmaxps_avx(auVar21,auVar18);
  BVar2 = (Bounds2f)vmovlhps_avx(auVar19,auVar18);
  this->domain = BVar2;
  uVar9 = *(ulong *)((filter->
                     super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
                     ).bits & 0xffffffffffff);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar9;
  auVar18 = vmovshdup_avx(auVar19);
  uVar7 = (uint)((float)uVar9 * 32.0);
  uVar10 = (uint)(auVar18._0_4_ * 32.0);
  local_b0.domain.pMin.super_Tuple2<pbrt::Point2,_float>.x = (float)((int)uVar7 >> 0x1f & uVar7);
  local_b0.domain.pMin.super_Tuple2<pbrt::Point2,_float>.y = (float)((int)uVar10 >> 0x1f & uVar10);
  uVar9 = (ulong)uVar7;
  if ((int)uVar7 < 1) {
    uVar9 = uVar15;
  }
  uVar12 = (ulong)uVar10;
  if ((int)uVar10 < 1) {
    uVar12 = uVar15;
  }
  local_b0.domain.pMax.super_Tuple2<pbrt::Point2,_float> =
       (Tuple2<pbrt::Point2,_float>)(uVar9 | uVar12 << 0x20);
  Array2D<float>::Array2D(&this->values,(Bounds2i *)&local_b0,alloc);
  (this->distrib).domain.pMin.super_Tuple2<pbrt::Point2,_float> =
       (Tuple2<pbrt::Point2,_float>)0x7f7fffff7f7fffff;
  (this->distrib).domain.pMax.super_Tuple2<pbrt::Point2,_float> =
       (Tuple2<pbrt::Point2,_float>)0xff7fffffff7fffff;
  auVar18 = ZEXT816(0) << 0x20;
  (this->distrib).pConditionalV.alloc.memoryResource = alloc.memoryResource;
  (this->distrib).pConditionalV.nStored = 0;
  (this->distrib).pConditionalV.ptr = (PiecewiseConstant1D *)auVar18._0_8_;
  (this->distrib).pConditionalV.nAlloc = auVar18._8_8_;
  (this->distrib).pMarginal.func.alloc.memoryResource = alloc.memoryResource;
  (this->distrib).pMarginal.func.ptr = (float *)auVar18._0_8_;
  (this->distrib).pMarginal.func.nAlloc = auVar18._8_8_;
  (this->distrib).pMarginal.func.nStored = 0;
  (this->distrib).pMarginal.cdf.alloc.memoryResource = alloc.memoryResource;
  (this->distrib).pMarginal.cdf.ptr = (float *)auVar18._0_8_;
  (this->distrib).pMarginal.cdf.nAlloc = auVar18._8_8_;
  (this->distrib).pMarginal.cdf.nStored = 0;
  (this->distrib).pMarginal.funcInt = 0.0;
  iVar17 = (this->values).extent.pMax.super_Tuple2<pbrt::Point2,_int>.y;
  iVar8 = (this->values).extent.pMin.super_Tuple2<pbrt::Point2,_int>.y;
  iVar16 = iVar17 - iVar8;
  if (iVar16 == 0 || iVar17 < iVar8) {
    iVar13 = (this->values).extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
    iVar11 = (this->values).extent.pMax.super_Tuple2<pbrt::Point2,_int>.x;
  }
  else {
    iVar13 = (this->values).extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
    iVar11 = (this->values).extent.pMax.super_Tuple2<pbrt::Point2,_int>.x;
    do {
      uVar7 = iVar11 - iVar13;
      iVar14 = (int)uVar15;
      if (uVar7 != 0 && iVar13 <= iVar11) {
        iVar17 = 0;
        do {
          auVar25._8_4_ = 0x3f800000;
          auVar25._0_8_ = 0x3f8000003f800000;
          auVar25._12_4_ = 0x3f800000;
          auVar24._8_8_ = 0;
          auVar24._0_8_ = (this->domain).pMin.super_Tuple2<pbrt::Point2,_float>;
          auVar19 = vinsertps_avx(ZEXT416((uint)((float)iVar17 + 0.5)),
                                  ZEXT416((uint)((float)iVar14 + 0.5)),0x10);
          auVar18 = vpinsrd_avx(ZEXT416(uVar7),
                                (this->values).extent.pMax.super_Tuple2<pbrt::Point2,_int>.y - iVar8
                                ,1);
          auVar18 = vcvtdq2ps_avx(auVar18);
          auVar18 = vdivps_avx(auVar19,auVar18);
          TVar1 = (this->domain).pMax.super_Tuple2<pbrt::Point2,_float>;
          auVar19 = vsubps_avx(auVar25,auVar18);
          auVar22._0_4_ = auVar18._0_4_ * TVar1.x;
          auVar22._4_4_ = auVar18._4_4_ * TVar1.y;
          auVar22._8_4_ = auVar18._8_4_ * 0.0;
          auVar22._12_4_ = auVar18._12_4_ * 0.0;
          auVar18 = vfmadd231ps_fma(auVar22,auVar24,auVar19);
          local_b0.domain.pMin.super_Tuple2<pbrt::Point2,_float> =
               (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar18);
          uVar9 = (filter->
                  super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
                  ).bits;
          uVar7 = (uint)(ushort)(uVar9 >> 0x30);
          if (uVar9 >> 0x30 < 3) {
            this_00 = (GaussianFilter *)(uVar9 & 0xffffffffffff);
            if (uVar7 == 2) {
              fVar20 = GaussianFilter::Evaluate(this_00,(Point2f *)&local_b0);
            }
            else {
              auVar4._8_4_ = 0x7fffffff;
              auVar4._0_8_ = 0x7fffffff7fffffff;
              auVar4._12_4_ = 0x7fffffff;
              auVar19 = vandps_avx512vl(auVar18,auVar4);
              fVar20 = 0.0;
              if (auVar19._0_4_ <= (this_00->radius).super_Tuple2<pbrt::Vector2,_float>.x) {
                auVar18 = vmovshdup_avx(auVar18);
                auVar5._8_4_ = 0x7fffffff;
                auVar5._0_8_ = 0x7fffffff7fffffff;
                auVar5._12_4_ = 0x7fffffff;
                auVar18 = vandps_avx512vl(auVar18,auVar5);
                uVar3 = vcmpss_avx512f(auVar18,ZEXT416((uint)(this_00->radius).
                                                             super_Tuple2<pbrt::Vector2,_float>.y),2
                                      );
                fVar20 = (float)((uint)((byte)uVar3 & 1) * 0x3f800000);
              }
            }
          }
          else {
            uVar7 = uVar7 - 2;
            this_01 = (MitchellFilter *)(uVar9 & 0xffffffffffff);
            if (uVar7 < 2) {
              fVar20 = MitchellFilter::Evaluate(this_01,(Point2f *)&local_b0);
            }
            else if (uVar7 == 2) {
              fVar20 = LanczosSincFilter::Evaluate
                                 ((LanczosSincFilter *)this_01,(Point2f *)&local_b0);
            }
            else {
              auVar6._8_4_ = 0x7fffffff;
              auVar6._0_8_ = 0x7fffffff7fffffff;
              auVar6._12_4_ = 0x7fffffff;
              auVar18 = vandps_avx512vl(auVar18,auVar6);
              auVar23._8_8_ = 0;
              auVar23._0_8_ = (this_01->radius).super_Tuple2<pbrt::Vector2,_float>;
              auVar18 = vsubps_avx(auVar23,auVar18);
              auVar18 = vmaxps_avx(auVar18,_DAT_0054e010);
              auVar19 = vmovshdup_avx(auVar18);
              fVar20 = auVar18._0_4_ * auVar19._0_4_;
            }
          }
          iVar11 = (this->values).extent.pMax.super_Tuple2<pbrt::Point2,_int>.x;
          iVar13 = (this->values).extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
          iVar8 = (this->values).extent.pMin.super_Tuple2<pbrt::Point2,_int>.y;
          uVar7 = iVar11 - iVar13;
          iVar16 = ((iVar14 - iVar8) * uVar7 - iVar13) + iVar17;
          iVar17 = iVar17 + 1;
          (this->values).values[iVar16] = fVar20;
        } while (iVar17 < (int)uVar7);
        iVar17 = (this->values).extent.pMax.super_Tuple2<pbrt::Point2,_int>.y;
      }
      uVar15 = (ulong)(iVar14 + 1U);
      iVar16 = iVar17 - iVar8;
    } while ((int)(iVar14 + 1U) < iVar16);
  }
  func.n = (size_t)((iVar11 - iVar13) * iVar16);
  func.ptr = (this->values).values;
  PiecewiseConstant2D::PiecewiseConstant2D(&local_b0,func,iVar11 - iVar13,iVar16,this->domain,alloc)
  ;
  (this->distrib).domain.pMin.super_Tuple2<pbrt::Point2,_float> =
       local_b0.domain.pMin.super_Tuple2<pbrt::Point2,_float>;
  (this->distrib).domain.pMax.super_Tuple2<pbrt::Point2,_float> =
       local_b0.domain.pMax.super_Tuple2<pbrt::Point2,_float>;
  pstd::
  vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>::
  operator=(&(this->distrib).pConditionalV,&local_b0.pConditionalV);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
            (&(this->distrib).pMarginal.func,&local_b0.pMarginal.func);
  other = &local_b0.pMarginal.cdf;
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
            (&(this->distrib).pMarginal.cdf,other);
  (this->distrib).pMarginal.funcInt = local_b0.pMarginal.funcInt;
  (this->distrib).pMarginal.min = local_b0.pMarginal.min;
  (this->distrib).pMarginal.max = local_b0.pMarginal.max;
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(other);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_b0.pMarginal.func);
  pstd::
  vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>::
  ~vector(&local_b0.pConditionalV);
  return;
}

Assistant:

FilterSampler::FilterSampler(FilterHandle filter, Allocator alloc)
    : domain(Point2f(-filter.Radius()), Point2f(filter.Radius())),
      values(int(32 * filter.Radius().x), int(32 * filter.Radius().y), alloc),
      distrib(alloc) {
    // Tabularize filter function in _values_
    for (int y = 0; y < values.ySize(); ++y)
        for (int x = 0; x < values.xSize(); ++x) {
            Point2f p = domain.Lerp(
                Point2f((x + 0.5f) / values.xSize(), (y + 0.5f) / values.ySize()));
            values(x, y) = filter.Evaluate(p);
        }

    // Compute sampling distribution for filter
    distrib = PiecewiseConstant2D(values, domain, alloc);
}